

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void destroy_free<CB_EXPLORE_ADF::cb_explore_adf>(void *temp)

{
  CB_EXPLORE_ADF::cb_explore_adf::~cb_explore_adf((cb_explore_adf *)temp);
  free(temp);
  return;
}

Assistant:

void destroy_free(void* temp)
{
  ((T*)temp)->~T();
  free(temp);
}